

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_panel.cpp
# Opt level: O3

Am_Value inter_value_from_panel_value_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Slot_Key in_SI;
  Am_Value AVar2;
  Am_Object panel;
  Am_Value panel_value;
  Am_Object AStack_28;
  Am_Value local_20;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  Am_Object::Get_Object(&AStack_28,in_SI,10);
  bVar1 = Am_Object::Valid(&AStack_28);
  if (bVar1) {
    local_20.type = 0;
    local_20.value.wrapper_value = (Am_Wrapper *)0x0;
    in_value = Am_Object::Get(&AStack_28,0x169,1);
    Am_Value::operator=(&local_20,in_value);
    get_inter_value_from_panel_value(&local_20,&AStack_28,(Am_Value *)self);
    Am_Value::~Am_Value(&local_20);
  }
  Am_Object::~Am_Object(&AStack_28);
  AVar2.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar2._0_8_ = self;
  return AVar2;
}

Assistant:

Am_Define_Formula(Am_Value, inter_value_from_panel_value)
{
  Am_Value value;
  Am_Object panel = self.Get_Owner();
  if (!panel.Valid()) {
    return value;
  }
  Am_Value panel_value;
  panel_value = panel.Peek(Am_VALUE);
  // std::cout << "** computing inter " << self << " value from panel value " <<
  //  panel_value <<std::endl <<std::flush;
  get_inter_value_from_panel_value(panel_value, panel, value);
  return value;
}